

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkreply_p.cpp
# Opt level: O2

void QHttpNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 1:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_001f6044:
        *puVar2 = pIVar3;
        goto switchD_001f5e05_default;
      }
      break;
    case 2:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_001f6044;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
      break;
    case 7:
    case 8:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_001f6044;
      }
      break;
    case 0xc:
    case 0xe:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
        goto LAB_001f6044;
      }
    }
    *puVar2 = 0;
    goto switchD_001f5e05_default;
  }
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                      ((QtMocHelpers *)_a,(void **)encrypted,0,0);
    if (((((!bVar1) &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(QList<QSslError>const&)>
                             ((QtMocHelpers *)_a,(void **)sslErrors,0,1), !bVar1)) &&
         (bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpNetworkReply::*)(QSslPreSharedKeyAuthenticator*)>
                            ((QtMocHelpers *)_a,(void **)preSharedKeyAuthenticationRequired,0,2),
         !bVar1)) &&
        ((((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                              ((QtMocHelpers *)_a,(void **)socketStartedConnecting,0,3), !bVar1 &&
           (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                              ((QtMocHelpers *)_a,(void **)requestSent,0,4), !bVar1)) &&
          ((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                              ((QtMocHelpers *)_a,(void **)readyRead,0,5), !bVar1 &&
           ((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                               ((QtMocHelpers *)_a,(void **)finished,0,6), !bVar1 &&
            (bVar1 = QtMocHelpers::
                     indexOfMethod<void(QHttpNetworkReply::*)(QNetworkReply::NetworkError,QString_const&)>
                               ((QtMocHelpers *)_a,(void **)finishedWithError,0,7), !bVar1)))))) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                            ((QtMocHelpers *)_a,(void **)headerChanged,0,9), !bVar1)))) &&
       ((((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(long_long,long_long)>
                             ((QtMocHelpers *)_a,(void **)dataReadProgress,0,10), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(long_long,long_long)>
                             ((QtMocHelpers *)_a,(void **)dataSendProgress,0,0xb), !bVar1)) &&
         (bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpNetworkReply::*)(QHttpNetworkRequest_const&,QAuthenticator*)>
                            ((QtMocHelpers *)_a,(void **)cacheCredentials,0,0xc), !bVar1)) &&
        ((bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpNetworkReply::*)(QNetworkProxy_const&,QAuthenticator*)>
                            ((QtMocHelpers *)_a,(void **)proxyAuthenticationRequired,0,0xd), !bVar1
         && (bVar1 = QtMocHelpers::
                     indexOfMethod<void(QHttpNetworkReply::*)(QHttpNetworkRequest_const&,QAuthenticator*)>
                               ((QtMocHelpers *)_a,(void **)authenticationRequired,0,0xe), !bVar1)))
        ))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(QUrl_const&,int,int)>
                  ((QtMocHelpers *)_a,(void **)redirected,0,0xf);
        return;
      }
      goto LAB_001f628d;
    }
    goto switchD_001f5e05_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_001f5e05_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      encrypted((QHttpNetworkReply *)_o);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      sslErrors((QHttpNetworkReply *)_o,(QList<QSslError> *)_a[1]);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      preSharedKeyAuthenticationRequired((QHttpNetworkReply *)_o,*_a[1]);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      socketStartedConnecting((QHttpNetworkReply *)_o);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      requestSent((QHttpNetworkReply *)_o);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      readyRead((QHttpNetworkReply *)_o);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      finished((QHttpNetworkReply *)_o);
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      finishedWithError((QHttpNetworkReply *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 8:
    local_28.d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_28.size = 0;
    finishedWithError((QHttpNetworkReply *)_o,*_a[1],(QString *)&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  default:
switchD_001f5e05_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      headerChanged((QHttpNetworkReply *)_o);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      dataReadProgress((QHttpNetworkReply *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      dataSendProgress((QHttpNetworkReply *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cacheCredentials((QHttpNetworkReply *)_o,(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      proxyAuthenticationRequired((QHttpNetworkReply *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      authenticationRequired((QHttpNetworkReply *)_o,(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      redirected((QHttpNetworkReply *)_o,(QUrl *)_a[1],*_a[2],*_a[3]);
      return;
    }
  }
LAB_001f628d:
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 2: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 3: _t->socketStartedConnecting(); break;
        case 4: _t->requestSent(); break;
        case 5: _t->readyRead(); break;
        case 6: _t->finished(); break;
        case 7: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 8: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 9: _t->headerChanged(); break;
        case 10: _t->dataReadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->dataSendProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->cacheCredentials((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 13: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 14: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 15: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 14:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QList<QSslError> & )>(_a, &QHttpNetworkReply::sslErrors, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpNetworkReply::preSharedKeyAuthenticationRequired, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::socketStartedConnecting, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::requestSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::readyRead, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::finished, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpNetworkReply::finishedWithError, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::headerChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataReadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataSendProgress, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::cacheCredentials, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpNetworkReply::proxyAuthenticationRequired, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::authenticationRequired, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QUrl & , int , int )>(_a, &QHttpNetworkReply::redirected, 15))
            return;
    }
}